

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas3_d.cpp
# Opt level: O0

void dtrsm(char side,char uplo,char transa,char diag,int m,int n,double alpha,double *a,int lda,
          double *b,int ldb)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  allocator<char> local_69;
  string local_68;
  byte local_41;
  double dStack_40;
  bool upper;
  double temp;
  int nrowa;
  bool nounit;
  int iStack_2c;
  bool lside;
  int k;
  int j;
  int info;
  int i;
  double alpha_local;
  int local_10;
  int n_local;
  int m_local;
  char diag_local;
  char transa_local;
  char uplo_local;
  char side_local;
  
  _info = alpha;
  alpha_local._4_4_ = n;
  local_10 = m;
  n_local._0_1_ = diag;
  n_local._1_1_ = transa;
  n_local._2_1_ = uplo;
  n_local._3_1_ = side;
  temp._7_1_ = lsame(side,'L');
  if ((bool)temp._7_1_) {
    temp._0_4_ = local_10;
  }
  else {
    temp._0_4_ = alpha_local._4_4_;
  }
  temp._6_1_ = lsame((char)n_local,'N');
  local_41 = lsame(n_local._2_1_,'U');
  k = 0;
  if (((temp._7_1_ & 1) != 0) || (bVar2 = lsame(n_local._3_1_,'R'), bVar2)) {
    if (((local_41 & 1) != 0) || (bVar2 = lsame(n_local._2_1_,'L'), bVar2)) {
      bVar2 = lsame(n_local._1_1_,'N');
      if ((bVar2) ||
         ((bVar2 = lsame(n_local._1_1_,'T'), bVar2 || (bVar2 = lsame(n_local._1_1_,'C'), bVar2)))) {
        bVar2 = lsame((char)n_local,'U');
        if ((bVar2) || (bVar2 = lsame((char)n_local,'N'), bVar2)) {
          if (local_10 < 0) {
            k = 5;
          }
          else if (alpha_local._4_4_ < 0) {
            k = 6;
          }
          else {
            iVar3 = i4_max(1,temp._0_4_);
            if (lda < iVar3) {
              k = 9;
            }
            else {
              iVar3 = i4_max(1,local_10);
              if (ldb < iVar3) {
                k = 0xb;
              }
            }
          }
        }
        else {
          k = 4;
        }
      }
      else {
        k = 3;
      }
    }
    else {
      k = 2;
    }
  }
  else {
    k = 1;
  }
  if (k == 0) {
    if (alpha_local._4_4_ != 0) {
      if ((_info != 0.0) || (NAN(_info))) {
        if ((temp._7_1_ & 1) == 0) {
          bVar2 = lsame(n_local._1_1_,'N');
          if (bVar2) {
            nrowa = alpha_local._4_4_;
            if ((local_41 & 1) == 0) {
              while (iStack_2c = nrowa + -1, -1 < iStack_2c) {
                if ((_info != 1.0) || (NAN(_info))) {
                  for (j = 0; j < local_10; j = j + 1) {
                    b[j + iStack_2c * ldb] = _info * b[j + iStack_2c * ldb];
                  }
                }
                for (; nrowa < alpha_local._4_4_; nrowa = nrowa + 1) {
                  if ((a[nrowa + iStack_2c * lda] != 0.0) || (NAN(a[nrowa + iStack_2c * lda]))) {
                    for (j = 0; j < local_10; j = j + 1) {
                      b[j + iStack_2c * ldb] =
                           -a[nrowa + iStack_2c * lda] * b[j + nrowa * ldb] + b[j + iStack_2c * ldb]
                      ;
                    }
                  }
                }
                nrowa = iStack_2c;
                if ((temp._6_1_ & 1) != 0) {
                  dVar1 = a[iStack_2c + iStack_2c * lda];
                  for (j = 0; j < local_10; j = j + 1) {
                    b[j + iStack_2c * ldb] = (1.0 / dVar1) * b[j + iStack_2c * ldb];
                  }
                }
              }
            }
            else {
              for (iStack_2c = 0; iStack_2c < alpha_local._4_4_; iStack_2c = iStack_2c + 1) {
                if ((_info != 1.0) || (NAN(_info))) {
                  for (j = 0; j < local_10; j = j + 1) {
                    b[j + iStack_2c * ldb] = _info * b[j + iStack_2c * ldb];
                  }
                }
                for (nrowa = 0; nrowa < iStack_2c; nrowa = nrowa + 1) {
                  if ((a[nrowa + iStack_2c * lda] != 0.0) || (NAN(a[nrowa + iStack_2c * lda]))) {
                    for (j = 0; j < local_10; j = j + 1) {
                      b[j + iStack_2c * ldb] =
                           -a[nrowa + iStack_2c * lda] * b[j + nrowa * ldb] + b[j + iStack_2c * ldb]
                      ;
                    }
                  }
                }
                if ((temp._6_1_ & 1) != 0) {
                  dVar1 = a[iStack_2c + iStack_2c * lda];
                  for (j = 0; j < local_10; j = j + 1) {
                    b[j + iStack_2c * ldb] = (1.0 / dVar1) * b[j + iStack_2c * ldb];
                  }
                }
              }
            }
          }
          else if ((local_41 & 1) == 0) {
            for (nrowa = 0; nrowa < alpha_local._4_4_; nrowa = nrowa + 1) {
              iStack_2c = nrowa;
              if ((temp._6_1_ & 1) != 0) {
                dVar1 = a[nrowa + nrowa * lda];
                for (j = 0; j < local_10; j = j + 1) {
                  b[j + nrowa * ldb] = (1.0 / dVar1) * b[j + nrowa * ldb];
                }
              }
              while (iStack_2c = iStack_2c + 1, iStack_2c < alpha_local._4_4_) {
                if ((a[iStack_2c + nrowa * lda] != 0.0) || (NAN(a[iStack_2c + nrowa * lda]))) {
                  dVar1 = a[iStack_2c + nrowa * lda];
                  for (j = 0; j < local_10; j = j + 1) {
                    b[j + iStack_2c * ldb] = -dVar1 * b[j + nrowa * ldb] + b[j + iStack_2c * ldb];
                  }
                }
              }
              if ((_info != 1.0) || (NAN(_info))) {
                for (j = 0; j < local_10; j = j + 1) {
                  b[j + nrowa * ldb] = _info * b[j + nrowa * ldb];
                }
              }
            }
          }
          else {
            while (nrowa = alpha_local._4_4_ + -1, -1 < nrowa) {
              if ((temp._6_1_ & 1) != 0) {
                dVar1 = a[nrowa + nrowa * lda];
                for (j = 0; j < local_10; j = j + 1) {
                  b[j + nrowa * ldb] = (1.0 / dVar1) * b[j + nrowa * ldb];
                }
              }
              for (iStack_2c = 0; iStack_2c < nrowa; iStack_2c = iStack_2c + 1) {
                if ((a[iStack_2c + nrowa * lda] != 0.0) || (NAN(a[iStack_2c + nrowa * lda]))) {
                  dVar1 = a[iStack_2c + nrowa * lda];
                  for (j = 0; j < local_10; j = j + 1) {
                    b[j + iStack_2c * ldb] = -dVar1 * b[j + nrowa * ldb] + b[j + iStack_2c * ldb];
                  }
                }
              }
              alpha_local._4_4_ = nrowa;
              if ((_info != 1.0) || (NAN(_info))) {
                for (j = 0; j < local_10; j = j + 1) {
                  b[j + nrowa * ldb] = _info * b[j + nrowa * ldb];
                }
              }
            }
          }
        }
        else {
          bVar2 = lsame(n_local._1_1_,'N');
          if (bVar2) {
            if ((local_41 & 1) == 0) {
              for (iStack_2c = 0; iStack_2c < alpha_local._4_4_; iStack_2c = iStack_2c + 1) {
                if ((_info != 1.0) || (NAN(_info))) {
                  for (j = 0; j < local_10; j = j + 1) {
                    b[j + iStack_2c * ldb] = _info * b[j + iStack_2c * ldb];
                  }
                }
                for (nrowa = 0; nrowa < local_10; nrowa = nrowa + 1) {
                  if ((b[nrowa + iStack_2c * ldb] != 0.0) || (NAN(b[nrowa + iStack_2c * ldb]))) {
                    j = nrowa;
                    if ((temp._6_1_ & 1) != 0) {
                      b[nrowa + iStack_2c * ldb] =
                           b[nrowa + iStack_2c * ldb] / a[nrowa + nrowa * lda];
                    }
                    while (j = j + 1, j < local_10) {
                      b[j + iStack_2c * ldb] =
                           -b[nrowa + iStack_2c * ldb] * a[j + nrowa * lda] + b[j + iStack_2c * ldb]
                      ;
                    }
                  }
                }
              }
            }
            else {
              for (iStack_2c = 0; iStack_2c < alpha_local._4_4_; iStack_2c = iStack_2c + 1) {
                if ((_info != 1.0) || (nrowa = local_10, NAN(_info))) {
                  for (j = 0; nrowa = local_10, j < local_10; j = j + 1) {
                    b[j + iStack_2c * ldb] = _info * b[j + iStack_2c * ldb];
                  }
                }
                while (nrowa = nrowa + -1, -1 < nrowa) {
                  if ((b[nrowa + iStack_2c * ldb] != 0.0) || (NAN(b[nrowa + iStack_2c * ldb]))) {
                    if ((temp._6_1_ & 1) != 0) {
                      b[nrowa + iStack_2c * ldb] =
                           b[nrowa + iStack_2c * ldb] / a[nrowa + nrowa * lda];
                    }
                    for (j = 0; j < nrowa; j = j + 1) {
                      b[j + iStack_2c * ldb] =
                           -b[nrowa + iStack_2c * ldb] * a[j + nrowa * lda] + b[j + iStack_2c * ldb]
                      ;
                    }
                  }
                }
              }
            }
          }
          else if ((local_41 & 1) == 0) {
            for (iStack_2c = 0; nrowa = local_10, iStack_2c < alpha_local._4_4_;
                iStack_2c = iStack_2c + 1) {
              while (j = nrowa + -1, -1 < j) {
                dStack_40 = _info * b[j + iStack_2c * ldb];
                for (; nrowa < local_10; nrowa = nrowa + 1) {
                  dStack_40 = -a[nrowa + j * lda] * b[nrowa + iStack_2c * ldb] + dStack_40;
                }
                if ((temp._6_1_ & 1) != 0) {
                  dStack_40 = dStack_40 / a[j + j * lda];
                }
                b[j + iStack_2c * ldb] = dStack_40;
                nrowa = j;
              }
            }
          }
          else {
            for (iStack_2c = 0; iStack_2c < alpha_local._4_4_; iStack_2c = iStack_2c + 1) {
              for (j = 0; j < local_10; j = j + 1) {
                dStack_40 = _info * b[j + iStack_2c * ldb];
                for (nrowa = 0; nrowa < j; nrowa = nrowa + 1) {
                  dStack_40 = -a[nrowa + j * lda] * b[nrowa + iStack_2c * ldb] + dStack_40;
                }
                if ((temp._6_1_ & 1) != 0) {
                  dStack_40 = dStack_40 / a[j + j * lda];
                }
                b[j + iStack_2c * ldb] = dStack_40;
              }
            }
          }
        }
      }
      else {
        for (iStack_2c = 0; iStack_2c < alpha_local._4_4_; iStack_2c = iStack_2c + 1) {
          for (j = 0; j < local_10; j = j + 1) {
            b[j + iStack_2c * ldb] = 0.0;
          }
        }
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"DTRSM",&local_69);
    xerbla(&local_68,k);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  return;
}

Assistant:

void dtrsm ( char side, char uplo, char transa, char diag, int m, int n, 
  double alpha, double a[], int lda, double b[], int ldb )

//****************************************************************************80
//
//  Purpose:
//
//    DTRSM solves A*X=alpha*B or X*A=alpha*B, for triangular A, rectangular B.
//
//  Discussion:
//
//    DTRSM solves one of the matrix equations
//      op( A )*X = alpha*B,   
//    or
//      X*op( A ) = alpha*B,
//    where alpha is a scalar, X and B are m by n matrices, A is a unit, or
//    non-unit,  upper or lower triangular matrix  and  op( A )  is one  of
//      op( A ) = A   or   op( A ) = A'.
//    The matrix X is overwritten on B.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    07 April 2014
//
//  Author:
//
//    This C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, char SIDE, specifies whether op( A ) appears on the left
//    or right of X as follows:
//    'L' or 'l': op( A )*X = alpha*B.
//    'R' or 'r': X*op( A ) = alpha*B.
//
//    Input, char UPLO, specifies whether the matrix A is an upper or
//    lower triangular matrix as follows:
//    'U' or 'u': A is an upper triangular matrix.
//    'L' or 'l': A is a lower triangular matrix.
//
//    Input, char TRANSA, specifies the form of op( A ) to be used in
//    the matrix multiplication as follows:
//    'N' or 'n': op( A ) = A.
//    'T' or 't': op( A ) = A'.
//    'C' or 'c': op( A ) = A'.
//
//    Input, char DIAG, specifies whether or not A is unit triangular
//    as follows:
//    'U' or 'u': A is assumed to be unit triangular.
//    'N' or 'n': A is not assumed to be unit triangular.
//
//    Input, int M, the number of rows of B.  0 <= M.
//
//    Input, int N, the number of columns of B.  0 <= N.
//
//    Input, double ALPHA, the scalar alpha.  When alpha is
//    0.0 then A is not referenced and B need not be set before entry.
//
//    Input, double A[LDA*K] where K is M when SIDE = 'L' or 'l'  
//    and K is N when SIDE = 'R' or 'r'.
//    Before entry  with  UPLO = 'U' or 'u',  the  leading  k by k
//    upper triangular part of the array  A must contain the upper
//    triangular matrix  and the strictly lower triangular part of
//    A is not referenced.
//    Before entry  with  UPLO = 'L' or 'l',  the  leading  k by k
//    lower triangular part of the array  A must contain the lower
//    triangular matrix  and the strictly upper triangular part of
//    A is not referenced.
//    Note that when  DIAG = 'U' or 'u',  the diagonal elements of
//    A  are not referenced either,  but are assumed to be  unity.
//
//    Input, int LDA, the first dimension of A as declared
//    in the calling (sub) program.  When  SIDE = 'L' or 'l'  then
//    LDA  must be at least  max( 1, m ),  when  SIDE = 'R' or 'r'
//    then LDA must be at least max( 1, n ).
//
//    Input/output, double B[LDB*N].
//    Before entry, the leading m by n part of the array B must
//    contain the right-hand side matrix B, and on exit is
//    overwritten by the solution matrix X.
//
//    Input, int LDB, the first dimension of B as declared
//    in the calling program.  LDB must be at least max ( 1, M ).
//
{
  int i;
  int info;
  int j;
  int k;
  bool lside;
  bool nounit;
  int nrowa;
  double temp;
  bool upper;
//
//  Test the input parameters.
//
  lside = lsame ( side, 'L' );

  if ( lside )
  {
    nrowa = m;
  }
  else
  {
    nrowa = n;
  }

  nounit = lsame ( diag, 'N' );
  upper = lsame ( uplo, 'U' );

  info = 0;

  if ( ( ! lside ) && ( ! lsame ( side, 'R' ) ) )
  {
    info = 1;
  }
  else if ( ( ! upper ) && ( ! lsame ( uplo, 'L' ) ) )
  {
    info = 2;
  }
  else if ( ( ! lsame ( transa, 'N' ) ) && 
            ( ! lsame ( transa, 'T' ) ) && 
            ( ! lsame ( transa, 'C' ) ) )
  {
    info = 3;
  }
  else if ( ( ! lsame ( diag, 'U' ) ) && ( ! lsame ( diag, 'N' ) ) )
  {
    info = 4;
  }
  else if ( m < 0 )
  {
    info = 5;
  }
  else if ( n < 0 )
  {
    info = 6;
  }
  else if ( lda < i4_max ( 1, nrowa ) )
  {
    info = 9;
  }
  else if ( ldb < i4_max ( 1, m ) )
  {
    info = 11;
  }

  if ( info != 0 ) 
  {
    xerbla ( "DTRSM", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( n == 0 )
  {
    return;
  }
//
//  and when alpha is 0.0.
//
  if ( alpha == 0.0 )
  {
    for ( j = 0; j < n; j++ )
    {
      for ( i = 0; i < m; i++ )
      {
        b[i+j*ldb] = 0.0;
      }
    }
    return;
  }
//
//  Start the operations.
//
  if ( lside ) 
  {
//
//  Form  B := alpha*inv( a )*B.
//
    if ( lsame ( transa, 'N' ) )
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = alpha * b[i+j*ldb];
            }
          }
          for ( k = m - 1; 0 <= k; k-- )
          {
            if ( b[k+j*ldb] != 0.0 )
            {
              if ( nounit )
              {
                b[k+j*ldb] = b[k+j*ldb] / a[k+k*lda];
              }
              for ( i = 0; i < k; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - b[k+j*ldb] * a[i+k*lda];
              }
            }
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = alpha * b[i+j*ldb];
            }
          }
          for ( k = 0; k < m; k++ )
          {
            if ( b[k+j*ldb] != 0.0 )
            {
              if ( nounit )
              {
                b[k+j*ldb] = b[k+j*ldb] / a[k+k*lda];
              }
              for ( i = k + 1; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - b[k+j*ldb] * a[i+k*lda];
              }
            }
          }
        }
      }
    }
//
//  Form  B := alpha*inv( A' )*B.
//
    else
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          for ( i = 0; i < m; i++ )
          {
            temp = alpha * b[i+j*ldb];
            for ( k = 0; k < i; k++ )
            {
              temp = temp - a[k+i*lda] * b[k+j*ldb];
            }
            if ( nounit )
            {
              temp = temp / a[i+i*lda];
            }
            b[i+j*ldb] = temp;
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          for ( i = m - 1; 0 <= i; i-- )
          {
            temp = alpha * b[i+j*ldb];
            for ( k = i + 1; k < m; k++ )
            {
              temp = temp - a[k+i*lda] * b[k+j*ldb];
            }
            if ( nounit )
            {
              temp = temp / a[i+i*lda];
            }
            b[i+j*ldb] = temp;
          }
        }
      }
    }
  }
//
//  Form  B := alpha*B*inv( A ).
//
  else
  {
    if ( lsame ( transa, 'N' ) )
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = alpha * b[i+j*ldb];
            }
          }
          for ( k = 0; k < j; k++ )
          {
            if ( a[k+j*lda] != 0.0 )
            {
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - a[k+j*lda] * b[i+k*ldb];
              }
            }
          }
          if ( nounit )
          {
            temp = 1.0 / a[j+j*lda];
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = temp * b[i+j*ldb];
            }
          }
        }
      }
      else
      {
        for ( j = n - 1; 0 <= j; j-- )
        {
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = alpha * b[i+j*ldb];
            }
          }
          for ( k = j + 1; k < n; k++ )
          {
            if ( a[k+j*lda] != 0.0 )
            {
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - a[k+j*lda] * b[i+k*ldb];
              }
            }
          }
          if ( nounit )
          {
            temp = 1.0 / a[j+j*lda];
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = temp * b[i+j*ldb];
            }
          }
        }
      }
    }
//
//  Form  B := alpha*B*inv( A' ).
//
    else
    {
      if ( upper )
      {
        for ( k = n - 1; 0 <= k; k-- )
        {
          if ( nounit )
          {
            temp = 1.0 / a[k+k*lda];
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = temp * b[i+k*ldb];
            }
          }
          for ( j = 0; j < k; j++ )
          {
            if ( a[j+k*lda] != 0.0 )
            {
              temp = a[j+k*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - temp * b[i+k*ldb];
              }
            }
          }
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = alpha * b[i+k*ldb];
            }
          }
        }
      }
      else
      {
        for ( k = 0; k < n; k++ )
        {
          if ( nounit )
          {
            temp = 1.0 / a[k+k*lda];
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = temp * b[i+k*ldb];
            }
          }
          for ( j = k + 1; j < n; j++ )
          {
            if ( a[j+k*lda] != 0.0 )
            {
              temp = a[j+k*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - temp * b[i+k*ldb];
              }
            }
          }
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = alpha * b[i+k*ldb];
            }
          }
        }
      }
    }
  }
  return;
}